

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_csp_enc.c
# Opt level: O3

void AccumulateRGBA(uint8_t *r_ptr,uint8_t *g_ptr,uint8_t *b_ptr,uint8_t *a_ptr,int rgb_stride,
                   uint16_t *dst,int width)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  uint32_t uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  
  iVar15 = width >> 1;
  lVar11 = (long)rgb_stride;
  if (iVar15 < 1) {
    uVar9 = 0;
  }
  else {
    lVar8 = (long)(rgb_stride + 4);
    uVar18 = 0;
    do {
      bVar1 = a_ptr[uVar18];
      bVar2 = a_ptr[uVar18 + lVar11];
      bVar3 = a_ptr[uVar18 + 4];
      bVar4 = a_ptr[uVar18 + lVar11 + 4];
      uVar17 = (uint)bVar3 + (uint)bVar4 + (uint)bVar2 + (uint)bVar1;
      if ((uVar17 == 0x3fc) || (uVar17 == 0)) {
        uVar14 = (uint)kGammaToLinearTab[r_ptr[uVar18 + lVar8]] +
                 (uint)kGammaToLinearTab[r_ptr[uVar18 + lVar11]] +
                 (uint)kGammaToLinearTab[r_ptr[uVar18 + 4]] + (uint)kGammaToLinearTab[r_ptr[uVar18]]
        ;
        uVar10 = uVar14 & 0x1ff;
        uVar9 = (ulong)(uVar14 >> 9);
        iVar13 = uVar10 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar10) * kLinearToGammaTab[uVar9]
        ;
        uVar14 = (uint)kGammaToLinearTab[g_ptr[uVar18 + lVar8]] +
                 (uint)kGammaToLinearTab[g_ptr[uVar18 + lVar11]] +
                 (uint)kGammaToLinearTab[g_ptr[uVar18 + 4]] + (uint)kGammaToLinearTab[g_ptr[uVar18]]
        ;
        uVar10 = uVar14 & 0x1ff;
        uVar9 = (ulong)(uVar14 >> 9);
        iVar12 = (0x200 - uVar10) * kLinearToGammaTab[uVar9] + uVar10 * kLinearToGammaTab[uVar9 + 1]
        ;
        uVar10 = (uint)kGammaToLinearTab[b_ptr[uVar18 + lVar8]] +
                 (uint)kGammaToLinearTab[b_ptr[uVar18 + lVar11]] +
                 (uint)kGammaToLinearTab[b_ptr[uVar18 + 4]] + (uint)kGammaToLinearTab[b_ptr[uVar18]]
        ;
        uVar14 = uVar10 >> 9;
      }
      else {
        uVar7 = kInvAlpha[uVar17];
        uVar14 = ((uint)kGammaToLinearTab[r_ptr[uVar18 + lVar8]] * (uint)bVar4 +
                  (uint)kGammaToLinearTab[r_ptr[uVar18 + lVar11]] * (uint)bVar2 +
                 (uint)kGammaToLinearTab[r_ptr[uVar18 + 4]] * (uint)bVar3 +
                 (uint)kGammaToLinearTab[r_ptr[uVar18]] * (uint)bVar1) * uVar7;
        uVar10 = uVar14 >> 0x11 & 0x1ff;
        uVar9 = (ulong)(uVar14 >> 0x1a);
        iVar13 = uVar10 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar10) * kLinearToGammaTab[uVar9]
        ;
        uVar10 = ((uint)kGammaToLinearTab[g_ptr[uVar18 + lVar8]] * (uint)bVar4 +
                  (uint)kGammaToLinearTab[g_ptr[uVar18 + lVar11]] * (uint)bVar2 +
                 (uint)kGammaToLinearTab[g_ptr[uVar18 + 4]] * (uint)bVar3 +
                 (uint)kGammaToLinearTab[g_ptr[uVar18]] * (uint)bVar1) * uVar7;
        uVar14 = uVar10 >> 0x11 & 0x1ff;
        uVar9 = (ulong)(uVar10 >> 0x1a);
        iVar12 = uVar14 * kLinearToGammaTab[uVar9 + 1] + (0x200 - uVar14) * kLinearToGammaTab[uVar9]
        ;
        uVar14 = ((uint)kGammaToLinearTab[b_ptr[uVar18 + lVar8]] * (uint)bVar4 +
                  (uint)kGammaToLinearTab[b_ptr[uVar18 + lVar11]] * (uint)bVar2 +
                 (uint)kGammaToLinearTab[b_ptr[uVar18 + 4]] * (uint)bVar3 +
                 (uint)kGammaToLinearTab[b_ptr[uVar18]] * (uint)bVar1) * uVar7;
        uVar10 = uVar14 >> 0x11;
        uVar14 = uVar14 >> 0x1a;
      }
      iVar5 = kLinearToGammaTab[(ulong)uVar14 + 1];
      iVar6 = kLinearToGammaTab[uVar14];
      *(short *)((long)dst + uVar18) = (short)(iVar13 + 0x40U >> 7);
      *(short *)((long)dst + uVar18 + 2) = (short)(iVar12 + 0x40U >> 7);
      *(short *)((long)dst + uVar18 + 4) =
           (short)((uVar10 & 0x1ff) * iVar5 + (0x200 - (uVar10 & 0x1ff)) * iVar6 + 0x40 >> 7);
      *(short *)((long)dst + uVar18 + 6) = (short)uVar17;
      uVar18 = uVar18 + 8;
      iVar15 = iVar15 + -1;
    } while (iVar15 != 0);
    uVar9 = uVar18 & 0xffffffff;
    dst = (uint16_t *)((long)dst + uVar18);
  }
  if ((width & 1U) != 0) {
    bVar1 = a_ptr[uVar9];
    bVar2 = a_ptr[lVar11 + uVar9];
    iVar15 = (uint)bVar2 + (uint)bVar1;
    if ((iVar15 == 0x1fe) || (iVar15 == 0)) {
      uVar17 = (uint)kGammaToLinearTab[r_ptr[lVar11 + uVar9]] +
               (uint)kGammaToLinearTab[r_ptr[uVar9]] & 0xff;
      uVar18 = (ulong)((uint)kGammaToLinearTab[r_ptr[lVar11 + uVar9]] +
                       (uint)kGammaToLinearTab[r_ptr[uVar9]] >> 8);
      uVar10 = (uint)kGammaToLinearTab[g_ptr[lVar11 + uVar9]] +
               (uint)kGammaToLinearTab[g_ptr[uVar9]] & 0xff;
      uVar16 = (ulong)((uint)kGammaToLinearTab[g_ptr[lVar11 + uVar9]] +
                       (uint)kGammaToLinearTab[g_ptr[uVar9]] >> 8);
      iVar13 = kLinearToGammaTab[uVar18 + 1] * uVar17 * 2 +
               (uVar17 * -2 + 0x200) * kLinearToGammaTab[uVar18];
      uVar17 = uVar10 * 2 * kLinearToGammaTab[uVar16 + 1] + 0x40 +
               (uVar10 * -2 + 0x200) * kLinearToGammaTab[uVar16];
      uVar14 = (uint)kGammaToLinearTab[b_ptr[lVar11 + uVar9]] +
               (uint)kGammaToLinearTab[b_ptr[uVar9]] >> 8;
      uVar10 = ((uint)kGammaToLinearTab[b_ptr[lVar11 + uVar9]] +
                (uint)kGammaToLinearTab[b_ptr[uVar9]] & 0xff) * 2;
    }
    else {
      uVar7 = kInvAlpha[(uint)(iVar15 * 2)];
      uVar10 = ((uint)kGammaToLinearTab[r_ptr[lVar11 + uVar9]] * (uint)bVar2 +
               (uint)kGammaToLinearTab[r_ptr[uVar9]] * (uint)bVar1) * uVar7;
      uVar17 = uVar10 >> 0x10 & 0x1ff;
      uVar18 = (ulong)(uVar10 >> 0x17 & 0xfc);
      uVar10 = ((uint)kGammaToLinearTab[g_ptr[lVar11 + uVar9]] * (uint)bVar2 +
               (uint)kGammaToLinearTab[g_ptr[uVar9]] * (uint)bVar1) * uVar7;
      uVar16 = (ulong)(uVar10 >> 0x17 & 0xfc);
      uVar10 = uVar10 >> 0x10 & 0x1ff;
      iVar13 = *(int *)((long)kLinearToGammaTab + uVar18 + 4) * uVar17 +
               (0x200 - uVar17) * *(int *)((long)kLinearToGammaTab + uVar18);
      uVar17 = uVar10 * *(int *)((long)kLinearToGammaTab + uVar16 + 4) + 0x40 +
               (0x200 - uVar10) * *(int *)((long)kLinearToGammaTab + uVar16);
      uVar14 = ((uint)kGammaToLinearTab[b_ptr[lVar11 + uVar9]] * (uint)bVar2 +
               (uint)kGammaToLinearTab[b_ptr[uVar9]] * (uint)bVar1) * uVar7;
      uVar10 = uVar14 >> 0x10 & 0x1ff;
      uVar14 = uVar14 >> 0x19 & 0x3f;
    }
    iVar12 = kLinearToGammaTab[(ulong)uVar14 + 1];
    iVar5 = kLinearToGammaTab[uVar14];
    *dst = (uint16_t)(iVar13 + 0x40U >> 7);
    dst[1] = (uint16_t)(uVar17 >> 7);
    dst[2] = (uint16_t)(iVar12 * uVar10 + (0x200 - uVar10) * iVar5 + 0x40 >> 7);
    dst[3] = (uint16_t)(iVar15 * 2);
  }
  return;
}

Assistant:

static WEBP_INLINE void AccumulateRGBA(const uint8_t* const r_ptr,
                                       const uint8_t* const g_ptr,
                                       const uint8_t* const b_ptr,
                                       const uint8_t* const a_ptr,
                                       int rgb_stride,
                                       uint16_t* dst, int width) {
  int i, j;
  // we loop over 2x2 blocks and produce one R/G/B/A value for each.
  for (i = 0, j = 0; i < (width >> 1); i += 1, j += 2 * 4, dst += 4) {
    const uint32_t a = SUM4ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM4(r_ptr + j, 4);
      g = SUM4(g_ptr + j, 4);
      b = SUM4(b_ptr + j, 4);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 4, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 4, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 4, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
  if (width & 1) {
    const uint32_t a = 2u * SUM2ALPHA(a_ptr + j);
    int r, g, b;
    if (a == 4 * 0xff || a == 0) {
      r = SUM2(r_ptr + j);
      g = SUM2(g_ptr + j);
      b = SUM2(b_ptr + j);
    } else {
      r = LinearToGammaWeighted(r_ptr + j, a_ptr + j, a, 0, rgb_stride);
      g = LinearToGammaWeighted(g_ptr + j, a_ptr + j, a, 0, rgb_stride);
      b = LinearToGammaWeighted(b_ptr + j, a_ptr + j, a, 0, rgb_stride);
    }
    dst[0] = r;
    dst[1] = g;
    dst[2] = b;
    dst[3] = a;
  }
}